

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O0

int floor1_encode(oggpack_buffer *opb,vorbis_block *vb,vorbis_look_floor1 *look,int *post,
                 int *ilogmask)

{
  int iVar1;
  vorbis_info_floor1 *pvVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint local_23c;
  int hy;
  int current;
  int n;
  int ly;
  int lx;
  int hx;
  int book;
  int val_2;
  int booknum;
  int maxval [8];
  int l;
  int k;
  int cshift;
  int cval;
  int bookas [8];
  int csub;
  int csubbits;
  int cdim;
  int class;
  int val_1;
  int headroom;
  int predicted;
  int y1;
  int y0;
  int x1;
  int x0;
  int hn;
  int ln;
  int val;
  codebook *books;
  static_codebook **sbooks;
  int out [65];
  codec_setup_info *ci;
  long posts;
  vorbis_info_floor1 *info;
  long j;
  long i;
  int *ilogmask_local;
  int *post_local;
  vorbis_look_floor1 *look_local;
  vorbis_block *vb_local;
  oggpack_buffer *opb_local;
  
  pvVar2 = look->vi;
  iVar7 = look->posts;
  pvVar3 = vb->vd->vi->codec_setup;
  lVar4 = *(long *)((long)pvVar3 + 0x1328);
  unique0x100008e9 = pvVar3;
  if (post == (int *)0x0) {
    oggpack_write(opb,0,1);
    memset(ilogmask,0,(long)(vb->pcmend / 2) << 2);
    opb_local._4_4_ = 0;
  }
  else {
    for (j = 0; j < iVar7; j = j + 1) {
      hn = post[j] & 0x7fff;
      switch(pvVar2->mult) {
      case 1:
        hn = hn >> 2;
        break;
      case 2:
        hn = hn >> 3;
        break;
      case 3:
        hn = (uint)hn / 0xc;
        break;
      case 4:
        hn = hn >> 4;
      }
      post[j] = hn | post[j] & 0x8000U;
    }
    iVar10 = *post;
    iVar9 = post[1];
    for (j = 2; j < iVar7; j = j + 1) {
      iVar8 = look->loneighbor[j + -2];
      iVar1 = look->hineighbor[j + -2];
      uVar5 = render_point(pvVar2->postlist[iVar8],pvVar2->postlist[iVar1],post[iVar8],post[iVar1],
                           pvVar2->postlist[j]);
      if (((post[j] & 0x8000U) == 0) && (uVar5 != post[j])) {
        local_23c = uVar5;
        if ((int)(look->quant_q - uVar5) < (int)uVar5) {
          local_23c = look->quant_q - uVar5;
        }
        iVar6 = post[j] - uVar5;
        if (iVar6 < 0) {
          if (SBORROW4(iVar6,-local_23c) == (int)(iVar6 + local_23c) < 0) {
            iVar6 = iVar6 * -2;
          }
          else {
            iVar6 = local_23c - iVar6;
          }
          cdim = iVar6 + -1;
        }
        else if (iVar6 < (int)local_23c) {
          cdim = iVar6 * 2;
        }
        else {
          cdim = iVar6 + local_23c;
        }
        out[j + -2] = cdim;
        post[iVar8] = post[iVar8] & 0x7fff;
        post[iVar1] = post[iVar1] & 0x7fff;
      }
      else {
        post[j] = uVar5 | 0x8000;
        out[j + -2] = 0;
      }
    }
    oggpack_write(opb,1,1);
    look->frames = look->frames + 1;
    iVar7 = ov_ilog(look->quant_q - 1);
    look->postbits = (long)(iVar7 << 1) + look->postbits;
    iVar7 = ov_ilog(look->quant_q - 1);
    oggpack_write(opb,(long)iVar10,iVar7);
    iVar7 = ov_ilog(look->quant_q - 1);
    oggpack_write(opb,(long)iVar9,iVar7);
    info = (vorbis_info_floor1 *)0x2;
    for (j = 0; j < pvVar2->partitions; j = j + 1) {
      iVar7 = pvVar2->partitionclass[j];
      iVar10 = pvVar2->class_dim[iVar7];
      iVar9 = pvVar2->class_subs[iVar7];
      iVar8 = 1 << ((byte)iVar9 & 0x1f);
      memset(&cshift,0,0x20);
      k = 0;
      l = 0;
      if (iVar9 != 0) {
        memset(&val_2,0,0x20);
        for (maxval[7] = 0; maxval[7] < iVar8; maxval[7] = maxval[7] + 1) {
          if (pvVar2->class_subbook[iVar7][maxval[7]] < 0) {
            (&val_2)[maxval[7]] = 1;
          }
          else {
            (&val_2)[maxval[7]] =
                 (int)*(undefined8 *)
                       (*(long *)((long)pvVar3 +
                                 (long)pvVar2->class_subbook[iVar7][maxval[7]] * 8 + 0xb28) + 8);
          }
        }
        for (maxval[7] = 0; maxval[7] < iVar10; maxval[7] = maxval[7] + 1) {
          for (maxval[6] = 0; maxval[6] < iVar8; maxval[6] = maxval[6] + 1) {
            if (out[(long)info->partitionclass + (long)maxval[7] + -6] < (&val_2)[maxval[6]]) {
              (&cshift)[maxval[7]] = maxval[6];
              break;
            }
          }
          k = (&cshift)[maxval[7]] << ((byte)l & 0x1f) | k;
          l = iVar9 + l;
        }
        iVar9 = vorbis_book_encode((codebook *)(lVar4 + (long)pvVar2->class_book[iVar7] * 0x60),k,
                                   opb);
        look->phrasebits = (long)iVar9 + look->phrasebits;
      }
      for (maxval[7] = 0; maxval[7] < iVar10; maxval[7] = maxval[7] + 1) {
        iVar9 = pvVar2->class_subbook[iVar7][(&cshift)[maxval[7]]];
        if ((-1 < iVar9) &&
           ((long)out[(long)info->partitionclass + (long)maxval[7] + -6] <
            *(long *)(lVar4 + (long)iVar9 * 0x60 + 8))) {
          iVar9 = vorbis_book_encode((codebook *)(lVar4 + (long)iVar9 * 0x60),
                                     out[(long)info->partitionclass + (long)maxval[7] + -6],opb);
          look->postbits = (long)iVar9 + look->postbits;
        }
      }
      info = (vorbis_info_floor1 *)((long)info->partitionclass + (long)iVar10 + -4);
    }
    ly = 0;
    n = 0;
    current = *post * pvVar2->mult;
    lVar4 = *(long *)((long)stack0xffffffffffffffa0 + vb->W * 8);
    for (info = (vorbis_info_floor1 *)0x1; (long)info < (long)look->posts;
        info = (vorbis_info_floor1 *)((long)&info->partitions + 1)) {
      iVar7 = look->forward_index[(long)info];
      if ((post[iVar7] & 0x7fffU) == post[iVar7]) {
        iVar10 = pvVar2->mult * (post[iVar7] & 0x7fffU);
        ly = pvVar2->postlist[iVar7];
        render_line0((int)(lVar4 / 2),n,ly,current,iVar10,ilogmask);
        current = iVar10;
        n = ly;
      }
    }
    for (info = (vorbis_info_floor1 *)(long)ly; (long)info < (long)(vb->pcmend / 2);
        info = (vorbis_info_floor1 *)((long)&info->partitions + 1)) {
      ilogmask[(long)info] = current;
    }
    opb_local._4_4_ = 1;
  }
  return opb_local._4_4_;
}

Assistant:

int floor1_encode(oggpack_buffer *opb,vorbis_block *vb,
                  vorbis_look_floor1 *look,
                  int *post,int *ilogmask){

  long i,j;
  vorbis_info_floor1 *info=look->vi;
  long posts=look->posts;
  codec_setup_info *ci=vb->vd->vi->codec_setup;
  int out[VIF_POSIT+2];
  static_codebook **sbooks=ci->book_param;
  codebook *books=ci->fullbooks;

  /* quantize values to multiplier spec */
  if(post){
    for(i=0;i<posts;i++){
      int val=post[i]&0x7fff;
      switch(info->mult){
      case 1: /* 1024 -> 256 */
        val>>=2;
        break;
      case 2: /* 1024 -> 128 */
        val>>=3;
        break;
      case 3: /* 1024 -> 86 */
        val/=12;
        break;
      case 4: /* 1024 -> 64 */
        val>>=4;
        break;
      }
      post[i]=val | (post[i]&0x8000);
    }

    out[0]=post[0];
    out[1]=post[1];

    /* find prediction values for each post and subtract them */
    for(i=2;i<posts;i++){
      int ln=look->loneighbor[i-2];
      int hn=look->hineighbor[i-2];
      int x0=info->postlist[ln];
      int x1=info->postlist[hn];
      int y0=post[ln];
      int y1=post[hn];

      int predicted=render_point(x0,x1,y0,y1,info->postlist[i]);

      if((post[i]&0x8000) || (predicted==post[i])){
        post[i]=predicted|0x8000; /* in case there was roundoff jitter
                                     in interpolation */
        out[i]=0;
      }else{
        int headroom=(look->quant_q-predicted<predicted?
                      look->quant_q-predicted:predicted);

        int val=post[i]-predicted;

        /* at this point the 'deviation' value is in the range +/- max
           range, but the real, unique range can always be mapped to
           only [0-maxrange).  So we want to wrap the deviation into
           this limited range, but do it in the way that least screws
           an essentially gaussian probability distribution. */

        if(val<0)
          if(val<-headroom)
            val=headroom-val-1;
          else
            val=-1-(val<<1);
        else
          if(val>=headroom)
            val= val+headroom;
          else
            val<<=1;

        out[i]=val;
        post[ln]&=0x7fff;
        post[hn]&=0x7fff;
      }
    }

    /* we have everything we need. pack it out */
    /* mark nontrivial floor */
    oggpack_write(opb,1,1);

    /* beginning/end post */
    look->frames++;
    look->postbits+=ov_ilog(look->quant_q-1)*2;
    oggpack_write(opb,out[0],ov_ilog(look->quant_q-1));
    oggpack_write(opb,out[1],ov_ilog(look->quant_q-1));


    /* partition by partition */
    for(i=0,j=2;i<info->partitions;i++){
      int class=info->partitionclass[i];
      int cdim=info->class_dim[class];
      int csubbits=info->class_subs[class];
      int csub=1<<csubbits;
      int bookas[8]={0,0,0,0,0,0,0,0};
      int cval=0;
      int cshift=0;
      int k,l;

      /* generate the partition's first stage cascade value */
      if(csubbits){
        int maxval[8]={0,0,0,0,0,0,0,0}; /* gcc's static analysis
                                            issues a warning without
                                            initialization */
        for(k=0;k<csub;k++){
          int booknum=info->class_subbook[class][k];
          if(booknum<0){
            maxval[k]=1;
          }else{
            maxval[k]=sbooks[info->class_subbook[class][k]]->entries;
          }
        }
        for(k=0;k<cdim;k++){
          for(l=0;l<csub;l++){
            int val=out[j+k];
            if(val<maxval[l]){
              bookas[k]=l;
              break;
            }
          }
          cval|= bookas[k]<<cshift;
          cshift+=csubbits;
        }
        /* write it */
        look->phrasebits+=
          vorbis_book_encode(books+info->class_book[class],cval,opb);

#ifdef TRAIN_FLOOR1
        {
          FILE *of;
          char buffer[80];
          sprintf(buffer,"line_%dx%ld_class%d.vqd",
                  vb->pcmend/2,posts-2,class);
          of=fopen(buffer,"a");
          fprintf(of,"%d\n",cval);
          fclose(of);
        }
#endif
      }

      /* write post values */
      for(k=0;k<cdim;k++){
        int book=info->class_subbook[class][bookas[k]];
        if(book>=0){
          /* hack to allow training with 'bad' books */
          if(out[j+k]<(books+book)->entries)
            look->postbits+=vorbis_book_encode(books+book,
                                               out[j+k],opb);
          /*else
            fprintf(stderr,"+!");*/

#ifdef TRAIN_FLOOR1
          {
            FILE *of;
            char buffer[80];
            sprintf(buffer,"line_%dx%ld_%dsub%d.vqd",
                    vb->pcmend/2,posts-2,class,bookas[k]);
            of=fopen(buffer,"a");
            fprintf(of,"%d\n",out[j+k]);
            fclose(of);
          }
#endif
        }
      }
      j+=cdim;
    }

    {
      /* generate quantized floor equivalent to what we'd unpack in decode */
      /* render the lines */
      int hx=0;
      int lx=0;
      int ly=post[0]*info->mult;
      int n=ci->blocksizes[vb->W]/2;

      for(j=1;j<look->posts;j++){
        int current=look->forward_index[j];
        int hy=post[current]&0x7fff;
        if(hy==post[current]){

          hy*=info->mult;
          hx=info->postlist[current];

          render_line0(n,lx,hx,ly,hy,ilogmask);

          lx=hx;
          ly=hy;
        }
      }
      for(j=hx;j<vb->pcmend/2;j++)ilogmask[j]=ly; /* be certain */
      return(1);
    }
  }else{
    oggpack_write(opb,0,1);
    memset(ilogmask,0,vb->pcmend/2*sizeof(*ilogmask));
    return(0);
  }
}